

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processDOMElement
          (PSVIWriterHandlers *this,XMLCh *encloseName,DOMElement *rootElem,XMLCh *elementName)

{
  long *plVar1;
  long lVar2;
  DOMElement *pDVar3;
  long *plVar4;
  XMLCh *pXVar5;
  DOMNamedNodeMap *attrs;
  DOMElement *elem;
  XMLSize_t i;
  DOMNodeList *elems;
  XMLCh *elementName_local;
  DOMElement *rootElem_local;
  XMLCh *encloseName_local;
  PSVIWriterHandlers *this_local;
  
  plVar1 = (long *)(**(code **)(*(long *)rootElem + 0x1a8))
                             (rootElem,&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              elementName);
  lVar2 = (**(code **)(*plVar1 + 0x18))();
  if (lVar2 == 0) {
    sendElementEmpty(this,encloseName);
  }
  else {
    sendIndentedElement(this,encloseName);
    elem = (DOMElement *)0x0;
    while( true ) {
      pDVar3 = (DOMElement *)(**(code **)(*plVar1 + 0x18))();
      if (pDVar3 <= elem) break;
      plVar4 = (long *)(**(code **)(*plVar1 + 0x10))(plVar1,elem);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
      pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0xb0))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar5);
      pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0xc0))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar5);
      pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0xb8))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar5);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgChildren);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCharacter);
      pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x108))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTextContent,pXVar5);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCharacter);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgChildren);
      attrs = (DOMNamedNodeMap *)(**(code **)(*plVar4 + 0x58))();
      processDOMAttributes(this,attrs);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
      elem = elem + 1;
    }
    sendUnindentedElement(this,encloseName);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processDOMElement(const XMLCh* const encloseName, DOMElement* rootElem, const XMLCh* const elementName) {
	DOMNodeList* elems = rootElem->getElementsByTagNameNS(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elementName);
	if (elems->getLength()==0) {
		sendElementEmpty(encloseName);
	} else {
		sendIndentedElement(encloseName);
		for (XMLSize_t i=0; i < elems->getLength(); i++) {
			DOMElement* elem = (DOMElement*)elems->item(i);
			sendIndentedElement(PSVIUni::fgElement);
			sendElementValue(PSVIUni::fgNamespaceName, elem->getNamespaceURI());
			sendElementValue(PSVIUni::fgLocalName, elem->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, elem->getPrefix());
			sendIndentedElement(PSVIUni::fgChildren);
			sendIndentedElement(PSVIUni::fgCharacter);
			sendElementValue(PSVIUni::fgTextContent, elem->getTextContent());
			sendUnindentedElement(PSVIUni::fgCharacter);
			sendUnindentedElement(PSVIUni::fgChildren);
			processDOMAttributes(elem->getAttributes());
			sendUnindentedElement(PSVIUni::fgElement);
		}
		sendUnindentedElement(encloseName);
	}
}